

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

uint int_pow(uint base,uint n)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (n != 0) {
    uVar1 = 1;
    uVar3 = (ulong)n;
    do {
      uVar2 = base;
      if ((uVar3 & 1) == 0) {
        uVar2 = 1;
      }
      uVar1 = uVar1 * uVar2;
      base = base * base;
      uVar2 = (uint)uVar3;
      uVar3 = uVar3 >> 1;
    } while (1 < uVar2);
    return uVar1;
  }
  return 1;
}

Assistant:

unsigned int_pow( unsigned base, unsigned n )
{
    unsigned result = 1;
    unsigned power = base;
    while (n > 0) {
        if ( n & 0x1 )
            result *= power;
            
        n >>= 1;
        power = power * power;
    }
        
    return result; 
}